

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.cpp
# Opt level: O3

int forward(socket_base_t *from_,zmq_socket_stats_t *from_stats_,socket_base_t *to_,
           zmq_socket_stats_t *to_stats_,socket_base_t *capture_,msg_t *msg_)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t sVar4;
  int *piVar5;
  msg_t *__optlen;
  long lVar6;
  int more;
  size_t moresz;
  int local_5c;
  ulong local_58;
  zmq_socket_stats_t *local_50;
  zmq_socket_stats_t *local_48;
  socket_base_t *local_40;
  uint64_t local_38;
  
  local_58 = 0;
  __optlen = msg_;
  local_50 = from_stats_;
  local_48 = to_stats_;
  local_40 = capture_;
  do {
    lVar6 = 0;
    do {
      sVar3 = zmq::socket_base_t::recv(from_,(int)msg_,(void *)0x1,(size_t)to_stats_,(int)capture_);
      if ((int)sVar3 < 0) {
        piVar5 = __errno_location();
        return -(uint)((int)local_58 == 0 || *piVar5 != 0xb);
      }
      sVar4 = zmq::msg_t::size(msg_);
      local_38 = 4;
      to_stats_ = (zmq_socket_stats_t *)&local_38;
      iVar1 = zmq::socket_base_t::getsockopt
                        (from_,0xd,(int)&local_5c,(int)to_stats_,capture_,(socklen_t *)__optlen);
      if (iVar1 < 0) {
        return -1;
      }
      iVar1 = capture(local_40,msg_,local_5c);
      if (iVar1 < 0) {
        return -1;
      }
      sVar3 = zmq::socket_base_t::send
                        (to_,(int)msg_,(void *)(ulong)((uint)(local_5c != 0) * 2),(size_t)to_stats_,
                         (int)capture_);
      if ((int)sVar3 < 0) {
        return -1;
      }
      lVar6 = lVar6 + sVar4;
    } while (local_5c != 0);
    local_50->msg_in = local_50->msg_in + 1;
    local_50->bytes_in = local_50->bytes_in + lVar6;
    local_48->msg_out = local_48->msg_out + 1;
    local_48->bytes_out = local_48->bytes_out + lVar6;
    uVar2 = (int)local_58 + 1;
    local_58 = (ulong)uVar2;
    if (uVar2 == 1000) {
      return 0;
    }
  } while( true );
}

Assistant:

static int forward (class zmq::socket_base_t *from_,
                    zmq_socket_stats_t *from_stats_,
                    class zmq::socket_base_t *to_,
                    zmq_socket_stats_t *to_stats_,
                    class zmq::socket_base_t *capture_,
                    zmq::msg_t *msg_)
{
    // Forward a burst of messages
    for (unsigned int i = 0; i < zmq::proxy_burst_size; i++) {
        int more;
        size_t moresz;
        size_t complete_msg_size = 0;

        // Forward all the parts of one message
        while (true) {
            int rc = from_->recv (msg_, ZMQ_DONTWAIT);
            if (rc < 0) {
                if (likely (errno == EAGAIN && i > 0))
                    return 0; // End of burst

                return -1;
            }

            complete_msg_size += msg_->size ();

            moresz = sizeof more;
            rc = from_->getsockopt (ZMQ_RCVMORE, &more, &moresz);
            if (unlikely (rc < 0))
                return -1;

            //  Copy message to capture socket if any
            rc = capture (capture_, msg_, more);
            if (unlikely (rc < 0))
                return -1;

            rc = to_->send (msg_, more ? ZMQ_SNDMORE : 0);
            if (unlikely (rc < 0))
                return -1;

            if (more == 0)
                break;
        }

        // A multipart message counts as 1 packet:
        from_stats_->msg_in++;
        from_stats_->bytes_in += complete_msg_size;
        to_stats_->msg_out++;
        to_stats_->bytes_out += complete_msg_size;
    }

    return 0;
}